

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O2

int equal_nocase(uchar *pattern,size_t pattern_len,uchar *subject,size_t subject_len,uint flags)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  
  iVar3 = 0;
  if (pattern_len == subject_len) {
    for (sVar5 = 0; pattern_len != sVar5; sVar5 = sVar5 + 1) {
      bVar1 = pattern[sVar5];
      if (bVar1 == 0) {
        return 0;
      }
      bVar2 = subject[sVar5];
      if (bVar1 != bVar2) {
        iVar3 = OPENSSL_tolower((uint)bVar1);
        iVar4 = OPENSSL_tolower((uint)bVar2);
        if (iVar3 != iVar4) {
          return 0;
        }
      }
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int equal_nocase(const unsigned char *pattern, size_t pattern_len,
                        const unsigned char *subject, size_t subject_len,
                        unsigned int flags) {
  if (pattern_len != subject_len) {
    return 0;
  }
  while (pattern_len) {
    unsigned char l = *pattern;
    unsigned char r = *subject;
    // The pattern must not contain NUL characters.
    if (l == 0) {
      return 0;
    }
    if (l != r) {
      if (OPENSSL_tolower(l) != OPENSSL_tolower(r)) {
        return 0;
      }
    }
    ++pattern;
    ++subject;
    --pattern_len;
  }
  return 1;
}